

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

CurrencyNameCacheEntry * getCacheEntry(char *locale,UErrorCode *ec)

{
  CurrencyNameCacheEntry *entry;
  UBool UVar1;
  int iVar2;
  char local_4b;
  char local_4a;
  char local_49;
  int8_t i_1;
  int8_t i;
  CurrencyNameCacheEntry *pCStack_48;
  int8_t found;
  CurrencyNameCacheEntry *cacheEntry;
  CurrencyNameStruct *currencySymbols;
  CurrencyNameStruct *pCStack_30;
  int32_t total_currency_symbol_count;
  CurrencyNameStruct *currencyNames;
  UErrorCode *pUStack_20;
  int32_t total_currency_name_count;
  UErrorCode *ec_local;
  char *locale_local;
  
  currencyNames._4_4_ = 0;
  pCStack_30 = (CurrencyNameStruct *)0x0;
  currencySymbols._4_4_ = 0;
  cacheEntry = (CurrencyNameCacheEntry *)0x0;
  pCStack_48 = (CurrencyNameCacheEntry *)0x0;
  pUStack_20 = ec;
  ec_local = (UErrorCode *)locale;
  umtx_lock_63(&gCurrencyCacheMutex);
  local_49 = -1;
  for (local_4a = '\0'; local_4a < '\n'; local_4a = local_4a + '\x01') {
    if ((currCache[local_4a] != (CurrencyNameCacheEntry *)0x0) &&
       (iVar2 = strcmp((char *)ec_local,currCache[local_4a]->locale), iVar2 == 0)) {
      local_49 = local_4a;
      break;
    }
  }
  if (local_49 != -1) {
    pCStack_48 = currCache[local_49];
    pCStack_48->refCount = pCStack_48->refCount + 1;
  }
  umtx_unlock_63(&gCurrencyCacheMutex);
  if (local_49 == -1) {
    collectCurrencyNames
              ((char *)ec_local,&stack0xffffffffffffffd0,(int32_t *)((long)&currencyNames + 4),
               (CurrencyNameStruct **)&cacheEntry,(int32_t *)((long)&currencySymbols + 4),pUStack_20
              );
    UVar1 = U_FAILURE(*pUStack_20);
    if (UVar1 != '\0') {
      return (CurrencyNameCacheEntry *)0x0;
    }
    umtx_lock_63(&gCurrencyCacheMutex);
    for (local_4b = '\0'; local_4b < '\n'; local_4b = local_4b + '\x01') {
      if ((currCache[local_4b] != (CurrencyNameCacheEntry *)0x0) &&
         (iVar2 = strcmp((char *)ec_local,currCache[local_4b]->locale), iVar2 == 0)) {
        local_49 = local_4b;
        break;
      }
    }
    if (local_49 == -1) {
      entry = currCache[currentCacheEntryIndex];
      if ((entry != (CurrencyNameCacheEntry *)0x0) &&
         (entry->refCount = entry->refCount + -1, entry->refCount == 0)) {
        deleteCacheEntry(entry);
      }
      pCStack_48 = (CurrencyNameCacheEntry *)uprv_malloc_63(0xc0);
      currCache[currentCacheEntryIndex] = pCStack_48;
      strcpy((char *)pCStack_48,(char *)ec_local);
      pCStack_48->currencyNames = pCStack_30;
      pCStack_48->totalCurrencyNameCount = currencyNames._4_4_;
      pCStack_48->currencySymbols = (CurrencyNameStruct *)cacheEntry;
      pCStack_48->totalCurrencySymbolCount = currencySymbols._4_4_;
      pCStack_48->refCount = 2;
      currentCacheEntryIndex = (int8_t)((currentCacheEntryIndex + 1) % 10);
      ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
    }
    else {
      deleteCurrencyNames(pCStack_30,currencyNames._4_4_);
      deleteCurrencyNames((CurrencyNameStruct *)cacheEntry,currencySymbols._4_4_);
      pCStack_48 = currCache[local_49];
      pCStack_48->refCount = pCStack_48->refCount + 1;
    }
    umtx_unlock_63(&gCurrencyCacheMutex);
  }
  return pCStack_48;
}

Assistant:

static CurrencyNameCacheEntry*
getCacheEntry(const char* locale, UErrorCode& ec) {

    int32_t total_currency_name_count = 0;
    CurrencyNameStruct* currencyNames = NULL;
    int32_t total_currency_symbol_count = 0;
    CurrencyNameStruct* currencySymbols = NULL;
    CurrencyNameCacheEntry* cacheEntry = NULL;

    umtx_lock(&gCurrencyCacheMutex);
    // in order to handle racing correctly,
    // not putting 'search' in a separate function.
    int8_t found = -1;
    for (int8_t i = 0; i < CURRENCY_NAME_CACHE_NUM; ++i) {
        if (currCache[i]!= NULL &&
            uprv_strcmp(locale, currCache[i]->locale) == 0) {
            found = i;
            break;
        }
    }
    if (found != -1) {
        cacheEntry = currCache[found];
        ++(cacheEntry->refCount);
    }
    umtx_unlock(&gCurrencyCacheMutex);
    if (found == -1) {
        collectCurrencyNames(locale, &currencyNames, &total_currency_name_count, &currencySymbols, &total_currency_symbol_count, ec);
        if (U_FAILURE(ec)) {
            return NULL;
        }
        umtx_lock(&gCurrencyCacheMutex);
        // check again.
        for (int8_t i = 0; i < CURRENCY_NAME_CACHE_NUM; ++i) {
            if (currCache[i]!= NULL &&
                uprv_strcmp(locale, currCache[i]->locale) == 0) {
                found = i;
                break;
            }
        }
        if (found == -1) {
            // insert new entry to 
            // currentCacheEntryIndex % CURRENCY_NAME_CACHE_NUM
            // and remove the existing entry 
            // currentCacheEntryIndex % CURRENCY_NAME_CACHE_NUM
            // from cache.
            cacheEntry = currCache[currentCacheEntryIndex];
            if (cacheEntry) {
                --(cacheEntry->refCount);
                // delete if the ref count is zero
                if (cacheEntry->refCount == 0) {
                    deleteCacheEntry(cacheEntry);
                }
            }
            cacheEntry = (CurrencyNameCacheEntry*)uprv_malloc(sizeof(CurrencyNameCacheEntry));
            currCache[currentCacheEntryIndex] = cacheEntry;
            uprv_strcpy(cacheEntry->locale, locale);
            cacheEntry->currencyNames = currencyNames;
            cacheEntry->totalCurrencyNameCount = total_currency_name_count;
            cacheEntry->currencySymbols = currencySymbols;
            cacheEntry->totalCurrencySymbolCount = total_currency_symbol_count;
            cacheEntry->refCount = 2; // one for cache, one for reference
            currentCacheEntryIndex = (currentCacheEntryIndex + 1) % CURRENCY_NAME_CACHE_NUM;
            ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
        } else {
            deleteCurrencyNames(currencyNames, total_currency_name_count);
            deleteCurrencyNames(currencySymbols, total_currency_symbol_count);
            cacheEntry = currCache[found];
            ++(cacheEntry->refCount);
        }
        umtx_unlock(&gCurrencyCacheMutex);
    }

    return cacheEntry;
}